

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort *puVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  ushort uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  FSE_CTable FVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  undefined1 in_XMM0 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  uVar20 = 1 << ((byte)tableLog & 0x1f);
  uVar19 = (ulong)uVar20;
  uVar12 = 1;
  if (tableLog != 0) {
    uVar12 = (ulong)(uVar20 >> 1);
  }
  if (((ulong)workSpace & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3809,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar17 = (ulong)(maxSymbolValue + 2);
  if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar17 & 0xfffffffffffffffe) * 2 + 8) {
    return 0xffffffffffffffd4;
  }
  *(short *)ct = (short)tableLog;
  *(short *)((long)ct + 2) = (short)maxSymbolValue;
  if (0xf < tableLog) {
    __assert_fail("tableLog < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x380e,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar13 = uVar20 - 1;
  iVar15 = (uVar20 >> 3) + (uVar20 >> 1) + 3;
  *(undefined2 *)workSpace = 0;
  uVar10 = maxSymbolValue + 1;
  sVar4 = (short)uVar20;
  if (uVar10 == 0) {
    *(short *)workSpace = sVar4 + 1;
  }
  else {
    uVar22 = uVar13;
    uVar11 = 0;
    do {
      uVar9 = (ulong)uVar11;
      uVar2 = normalizedCounter[uVar9];
      if (uVar2 == 0xffff) {
        *(short *)((long)workSpace + (ulong)(uVar11 + 1) * 2) =
             *(short *)((long)workSpace + uVar9 * 2) + 1;
        uVar9 = (ulong)uVar22;
        uVar22 = uVar22 - 1;
        *(char *)((long)workSpace + uVar9 + uVar17 * 2) = (char)uVar11;
      }
      else {
        if ((short)uVar2 < 0) {
          __assert_fail("normalizedCounter[u-1] >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x381f,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        puVar1 = (ushort *)((long)workSpace + uVar9 * 2);
        uVar8 = *puVar1;
        *(ushort *)((long)workSpace + (ulong)(uVar11 + 1) * 2) = uVar2 + *puVar1;
        if (CARRY2(uVar2,uVar8)) {
          __assert_fail("cumul[u] >= cumul[u-1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3821,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      uVar16 = uVar11 + 2;
      uVar11 = uVar11 + 1;
    } while (uVar16 <= uVar10);
    *(short *)((long)workSpace + (ulong)uVar10 * 2) = sVar4 + 1;
    auVar7 = _DAT_00277800;
    if (uVar22 != uVar13) {
      if (uVar10 != 0) {
        uVar9 = 0;
        uVar11 = 0;
        do {
          sVar3 = normalizedCounter[uVar9];
          if (0 < sVar3) {
            iVar23 = 0;
            do {
              *(char *)((long)workSpace + (ulong)uVar11 + uVar17 * 2) = (char)uVar9;
              do {
                uVar11 = uVar11 + iVar15 & uVar13;
              } while (uVar22 < uVar11);
              iVar23 = iVar23 + 1;
            } while (iVar23 != sVar3);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar10);
        if (uVar11 != 0) {
          __assert_fail("position==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3859,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      goto LAB_00156aa3;
    }
    lVar5 = uVar19 + uVar17 * 2;
    if (uVar10 != 0) {
      lVar24 = 0;
      auVar26 = pmovsxbq(in_XMM0,0x100);
      lVar21 = 0;
      uVar10 = 0;
      do {
        uVar2 = normalizedCounter[uVar10];
        *(long *)((long)workSpace + lVar24 + lVar5) = lVar21;
        if (8 < (long)(short)uVar2) {
          uVar8 = 0x10;
          if (0x10 < uVar2) {
            uVar8 = uVar2;
          }
          lVar6 = lVar24 + lVar5;
          uVar18 = (ulong)uVar8 - 9;
          auVar29._8_4_ = (int)uVar18;
          auVar29._0_8_ = uVar18;
          auVar29._12_4_ = (int)(uVar18 >> 0x20);
          auVar27._0_8_ = uVar18 >> 3;
          auVar27._8_8_ = auVar29._8_8_ >> 3;
          auVar27 = auVar27 ^ auVar7;
          uVar9 = 0;
          do {
            auVar28._8_4_ = (int)uVar9;
            auVar28._0_8_ = uVar9;
            auVar28._12_4_ = (int)(uVar9 >> 0x20);
            auVar29 = (auVar28 | auVar26) ^ auVar7;
            if ((bool)(~(auVar27._4_4_ < auVar29._4_4_ ||
                        auVar27._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar27._4_4_) & 1)) {
              *(long *)((long)workSpace + uVar9 * 8 + lVar6 + 8) = lVar21;
            }
            if (auVar29._12_4_ <= auVar27._12_4_ &&
                (auVar29._8_4_ <= auVar27._8_4_ || auVar29._12_4_ != auVar27._12_4_)) {
              *(long *)((long)workSpace + uVar9 * 8 + lVar6 + 0x10) = lVar21;
            }
            uVar9 = uVar9 + 2;
          } while (((uVar18 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
        }
        if ((short)uVar2 < 0) {
          __assert_fail("n>=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3837,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        lVar24 = lVar24 + (short)uVar2;
        lVar21 = lVar21 + 0x101010101010101;
        bVar25 = uVar10 != maxSymbolValue;
        uVar10 = uVar10 + 1;
      } while (bVar25);
    }
  }
  lVar5 = uVar19 + uVar17 * 2;
  if ((uVar20 & 1) != 0) {
    __assert_fail("tableSize % unroll == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3842,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar9 = 0;
  uVar10 = 0;
  do {
    *(undefined1 *)((long)workSpace + (ulong)(uVar10 & uVar13) + uVar17 * 2) =
         *(undefined1 *)((long)workSpace + uVar9 + lVar5);
    *(undefined1 *)((long)workSpace + (ulong)(uVar10 + iVar15 & uVar13) + uVar17 * 2) =
         *(undefined1 *)((long)workSpace + uVar9 + lVar5 + 1);
    uVar10 = uVar10 + iVar15 * 2 & uVar13;
    uVar9 = uVar9 + 2;
  } while (uVar9 < uVar19);
  if (uVar10 != 0) {
    __assert_fail("position == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x384b,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
LAB_00156aa3:
  uVar9 = 0;
  do {
    uVar18 = (ulong)*(byte *)((long)workSpace + uVar9 + uVar17 * 2);
    uVar2 = *(ushort *)((long)workSpace + uVar18 * 2);
    *(ushort *)((long)workSpace + uVar18 * 2) = uVar2 + 1;
    *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = sVar4 + (short)uVar9;
    uVar9 = uVar9 + 1;
  } while (uVar19 != uVar9);
  FVar14 = tableLog * 0x10000 - uVar20;
  uVar20 = 0;
  iVar15 = 0;
  do {
    uVar19 = (ulong)uVar20;
    uVar2 = normalizedCounter[uVar19];
    if ((uVar2 == 0xffff) || (uVar2 == 1)) {
      ct[uVar12 + uVar19 * 2 + 2] = FVar14;
      if (iVar15 < 0) {
        __assert_fail("total <= INT_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3870,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      ct[uVar12 + uVar19 * 2 + 1] = iVar15 - 1;
      iVar15 = iVar15 + 1;
    }
    else {
      uVar10 = (uint)uVar2;
      if (uVar10 == 0) {
        ct[uVar12 + uVar19 * 2 + 2] = FVar14 + 0x10000;
      }
      else {
        if ((short)uVar2 < 2) {
          __assert_fail("normalizedCounter[s] > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3875,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar13 = uVar2 - 1 & 0xffff;
        iVar23 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar23 == 0; iVar23 = iVar23 + -1) {
          }
        }
        ct[uVar12 + uVar19 * 2 + 2] =
             (tableLog - iVar23) * 0x10000 - (uVar10 << ((byte)(tableLog - iVar23) & 0x1f));
        ct[uVar12 + uVar19 * 2 + 1] = iVar15 - uVar10;
        iVar15 = iVar15 + (uint)uVar2;
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 <= maxSymbolValue);
  return 0;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}